

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_exchange.cpp
# Opt level: O2

void libtorrent::aux::ed25519_key_exchange
               (uchar *shared_secret,uchar *public_key,uchar *private_key)

{
  byte *g;
  uint i;
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  fe z3;
  fe x3;
  fe x2;
  fe tmp1;
  fe tmp0;
  fe z2;
  fe x1;
  byte local_198 [80];
  i32 local_148 [12];
  i32 local_118 [12];
  i32 local_e8 [12];
  i32 local_b8 [12];
  i32 local_88 [12];
  i32 local_58 [10];
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    local_198[lVar2] = private_key[lVar2];
  }
  local_198[0] = local_198[0] & 0xf8;
  local_198[0x1f] = local_198[0x1f] & 0x3f | 0x40;
  fe_frombytes(local_58,public_key);
  fe_1(local_e8);
  fe_add(local_b8,local_58,local_e8);
  fe_sub(local_e8,local_e8,local_58);
  fe_invert(local_e8,local_e8);
  fe_mul(local_58,local_b8,local_e8);
  fe_1(local_118);
  fe_0(local_88);
  fe_copy(local_148,local_58);
  fe_1((i32 *)(local_198 + 0x20));
  uVar4 = 0;
  for (uVar3 = 0xfe; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar1 = (uint)((local_198[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0);
    uVar4 = uVar4 ^ uVar1;
    fe_cswap(local_118,local_148,uVar4);
    g = local_198 + 0x20;
    fe_cswap(local_88,(i32 *)g,uVar4);
    fe_sub(local_b8,local_148,(i32 *)g);
    fe_sub(local_e8,local_118,local_88);
    fe_add(local_118,local_118,local_88);
    fe_add(local_88,local_148,(i32 *)g);
    fe_mul((i32 *)g,local_b8,local_118);
    fe_mul(local_88,local_88,local_e8);
    fe_sq(local_b8,local_e8);
    fe_sq(local_e8,local_118);
    fe_add(local_148,(i32 *)g,local_88);
    fe_sub(local_88,(i32 *)g,local_88);
    fe_mul(local_118,local_e8,local_b8);
    fe_sub(local_e8,local_e8,local_b8);
    fe_sq(local_88,local_88);
    fe_mul121666((i32 *)g,local_e8);
    fe_sq(local_148,local_148);
    fe_add(local_b8,local_b8,(i32 *)g);
    fe_mul((i32 *)g,local_58,local_88);
    fe_mul(local_88,local_e8,local_b8);
    uVar4 = uVar1;
  }
  fe_cswap(local_118,local_148,uVar4);
  fe_cswap(local_88,(i32 *)(local_198 + 0x20),uVar4);
  fe_invert(local_88,local_88);
  fe_mul(local_118,local_118,local_88);
  fe_tobytes(shared_secret,local_118);
  return;
}

Assistant:

void ed25519_key_exchange(unsigned char *shared_secret
	, const unsigned char *public_key, const unsigned char *private_key) {
    unsigned char e[32];
    unsigned int i;
    
    fe x1;
    fe x2;
    fe z2;
    fe x3;
    fe z3;
    fe tmp0;
    fe tmp1;

    int pos;
    unsigned int swap;
    unsigned int b;

    /* copy the private key and make sure it's valid */
    for (i = 0; i < 32; ++i) {
        e[i] = private_key[i];
    }

    e[0] &= 248;
    e[31] &= 63;
    e[31] |= 64;

    /* unpack the public key and convert edwards to montgomery */
    /* due to CodesInChaos: montgomeryX = (edwardsY + 1)*inverse(1 - edwardsY) mod p */
    fe_frombytes(x1, public_key);
    fe_1(tmp1);
    fe_add(tmp0, x1, tmp1);
    fe_sub(tmp1, tmp1, x1);
    fe_invert(tmp1, tmp1);
    fe_mul(x1, tmp0, tmp1);

    fe_1(x2);
    fe_0(z2);
    fe_copy(x3, x1);
    fe_1(z3);

    swap = 0;
    for (pos = 254; pos >= 0; --pos) {
        b = e[pos / 8] >> (pos & 7);
        b &= 1;
        swap ^= b;
        fe_cswap(x2, x3, swap);
        fe_cswap(z2, z3, swap);
        swap = b;

        /* from montgomery.h */
        fe_sub(tmp0, x3, z3);
        fe_sub(tmp1, x2, z2);
        fe_add(x2, x2, z2);
        fe_add(z2, x3, z3);
        fe_mul(z3, tmp0, x2);
        fe_mul(z2, z2, tmp1);
        fe_sq(tmp0, tmp1);
        fe_sq(tmp1, x2);
        fe_add(x3, z3, z2);
        fe_sub(z2, z3, z2);
        fe_mul(x2, tmp1, tmp0);
        fe_sub(tmp1, tmp1, tmp0);
        fe_sq(z2, z2);
        fe_mul121666(z3, tmp1);
        fe_sq(x3, x3);
        fe_add(tmp0, tmp0, z3);
        fe_mul(z3, x1, z2);
        fe_mul(z2, tmp1, tmp0);
    }

    fe_cswap(x2, x3, swap);
    fe_cswap(z2, z3, swap);

    fe_invert(z2, z2);
    fe_mul(x2, x2, z2);
    fe_tobytes(shared_secret, x2);
}